

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::yarn2>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,yarn2 *r1,yarn2 *r2,long N,long skip1,long skip2)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  uint local_9c;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_50 = N;
  local_48 = skip1;
  local_40 = skip2;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_78,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_98,N);
    lVar3 = 0;
    do {
      iVar8 = (r1->S).r[0];
      uVar5 = (long)(r1->S).r[1] * (long)(r1->P).a[1] + (long)(r1->P).a[0] * (long)iVar8;
      uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
      uVar5 = uVar6 - 0xfffffffe;
      if (uVar6 < 0xfffffffe) {
        uVar5 = uVar6;
      }
      uVar2 = (uint)uVar5 + 0x80000001;
      if (uVar5 < 0x7fffffff) {
        uVar2 = (uint)uVar5;
      }
      (r1->S).r[1] = iVar8;
      (r1->S).r[0] = uVar2;
      local_9c = 0;
      if (uVar2 != 0) {
        uVar1 = (uint)((ulong)*(uint *)(trng::yarn2::g + (ulong)(uVar2 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn2::g + (long)((int)uVar2 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar8 = (int)((ulong)*(uint *)(trng::yarn2::g + (ulong)(uVar2 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn2::g + (long)((int)uVar2 >> 0x10) * 4 + 0x40000) >>
                     0x1f);
        uVar2 = uVar1 + iVar8;
        local_9c = uVar1 + 0x80000001 + iVar8;
        if (uVar2 < 0x7fffffff) {
          local_9c = uVar2;
        }
      }
      local_38 = lVar3;
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_9c);
      }
      else {
        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_9c;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar8 = (r2->S).r[0];
      uVar5 = (long)(r2->S).r[1] * (long)(r2->P).a[1] + (long)(r2->P).a[0] * (long)iVar8;
      uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
      uVar5 = uVar6 - 0xfffffffe;
      if (uVar6 < 0xfffffffe) {
        uVar5 = uVar6;
      }
      (r2->S).r[1] = iVar8;
      uVar2 = (uint)uVar5 + 0x80000001;
      if (uVar5 < 0x7fffffff) {
        uVar2 = (uint)uVar5;
      }
      (r2->S).r[0] = uVar2;
      if (uVar2 == 0) {
        local_9c = 0;
      }
      else {
        uVar1 = (uint)((ulong)*(uint *)(trng::yarn2::g + (ulong)(uVar2 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn2::g + (long)((int)uVar2 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar8 = (int)((ulong)*(uint *)(trng::yarn2::g + (ulong)(uVar2 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn2::g + (long)((int)uVar2 >> 0x10) * 4 + 0x40000) >>
                     0x1f);
        uVar2 = uVar1 + iVar8;
        local_9c = uVar1 + 0x80000001 + iVar8;
        if (uVar2 < 0x7fffffff) {
          local_9c = uVar2;
        }
      }
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_9c);
      }
      else {
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_9c;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_48) {
        lVar3 = local_48;
        iVar8 = (r1->S).r[0];
        iVar4 = (r1->S).r[1];
        do {
          iVar7 = iVar8;
          uVar5 = (long)iVar4 * (long)(r1->P).a[1] + (long)iVar7 * (long)(r1->P).a[0];
          uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
          uVar5 = uVar6 - 0xfffffffe;
          if (uVar6 < 0xfffffffe) {
            uVar5 = uVar6;
          }
          iVar8 = (int)uVar5 + -0x7fffffff;
          if (uVar5 < 0x7fffffff) {
            iVar8 = (int)uVar5;
          }
          lVar3 = lVar3 + -1;
          iVar4 = iVar7;
        } while (lVar3 != 0);
        (r1->S).r[1] = iVar7;
        (r1->S).r[0] = iVar8;
      }
      if (0 < local_40) {
        lVar3 = local_40;
        iVar8 = (r2->S).r[0];
        iVar4 = (r2->S).r[1];
        do {
          iVar7 = iVar8;
          uVar5 = (long)iVar4 * (long)(r2->P).a[1] + (long)iVar7 * (long)(r2->P).a[0];
          uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
          uVar5 = uVar6 - 0xfffffffe;
          if (uVar6 < 0xfffffffe) {
            uVar5 = uVar6;
          }
          iVar8 = (int)uVar5 + -0x7fffffff;
          if (uVar5 < 0x7fffffff) {
            iVar8 = (int)uVar5;
          }
          lVar3 = lVar3 + -1;
          iVar4 = iVar7;
        } while (lVar3 != 0);
        (r2->S).r[1] = iVar7;
        (r2->S).r[0] = iVar8;
      }
      lVar3 = local_38 + 1;
    } while (lVar3 != local_50);
  }
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_58,&local_78,&local_98);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         local_58;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}